

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy_testcase_api_tests.cpp
# Opt level: O0

void __thiscall
iu_EventListenerTest_x_iutest_x_FlagCheck_Test::Body
          (iu_EventListenerTest_x_iutest_x_FlagCheck_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_430;
  AssertionHelper local_410;
  Fixed local_3e0;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult iutest_ar_1;
  string local_220;
  AssertionHelper local_200;
  Fixed local_1d0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_EventListenerTest_x_iutest_x_FlagCheck_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_38,&listener->called_OnTestCaseStart);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_220,(internal *)local_38,(AssertionResult *)"listener->called_OnTestCaseStart"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/legacy_testcase_api_tests.cpp"
               ,0xc2,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_251 = (bool)(~listener->called_OnTestCaseEnd & 1);
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_250,&local_251);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      memset(&local_3e0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e0);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_430,(internal *)local_250,
                 (AssertionResult *)"listener->called_OnTestCaseEnd","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_410,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/legacy_testcase_api_tests.cpp"
                 ,0xc3,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_410,&local_3e0);
      iutest::AssertionHelper::~AssertionHelper(&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  }
  return;
}

Assistant:

IUTEST(EventListenerTest, FlagCheck)
{
    IUTEST_ASSERT_TRUE( listener->called_OnTestCaseStart );
    IUTEST_ASSERT_FALSE( listener->called_OnTestCaseEnd );
}